

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void __thiscall Util::PermuteSudoku(Util *this,char *puzzle,bool pencilmark)

{
  int iVar1;
  int row;
  long lVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  int digit;
  long lVar7;
  int iVar8;
  size_type __new_size;
  char acStack_17c [156];
  undefined8 uStack_e0;
  vector<char,_std::allocator<char>_> out_puzzle;
  array<int,_9UL> digit_permutation;
  int local_94 [3];
  array<int,_9UL> col_permutation;
  array<int,_9UL> row_permutation;
  
  digit_permutation._M_elems[0] = 0;
  digit_permutation._M_elems[1] = 1;
  digit_permutation._M_elems[2] = 2;
  digit_permutation._M_elems[3] = 3;
  digit_permutation._M_elems[4] = 4;
  digit_permutation._M_elems[5] = 5;
  digit_permutation._M_elems[6] = 6;
  digit_permutation._M_elems[7] = 7;
  iVar8 = 8;
  uStack_e0 = 0x105141;
  digit_permutation._M_elems[8] = iVar8;
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            (digit_permutation._M_elems,local_94,&this->rng_);
  row_permutation._M_elems[0] = 0;
  row_permutation._M_elems[1] = 1;
  row_permutation._M_elems[2] = 2;
  row_permutation._M_elems[3] = 3;
  row_permutation._M_elems[4] = 4;
  row_permutation._M_elems[5] = 5;
  row_permutation._M_elems[6] = 6;
  row_permutation._M_elems[7] = 7;
  col_permutation._M_elems[0] = 0;
  col_permutation._M_elems[1] = 1;
  col_permutation._M_elems[2] = 2;
  col_permutation._M_elems[3] = 3;
  col_permutation._M_elems[4] = 4;
  col_permutation._M_elems[5] = 5;
  col_permutation._M_elems[6] = 6;
  col_permutation._M_elems[7] = 7;
  uStack_e0 = 0x105172;
  col_permutation._M_elems[8] = iVar8;
  row_permutation._M_elems[8] = iVar8;
  BlockShuffle(this,&col_permutation);
  uStack_e0 = 0x10517d;
  BlockShuffle(this,&row_permutation);
  __new_size = 0x51;
  if ((int)CONCAT71(in_register_00000011,pencilmark) != 0) {
    __new_size = 0x2d9;
  }
  out_puzzle.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  out_puzzle.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  out_puzzle.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uStack_e0 = 0x1051a4;
  std::vector<char,_std::allocator<char>_>::resize(&out_puzzle,__new_size);
  uStack_e0 = 0x2e;
  pcVar3 = puzzle;
  for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
    pcVar4 = pcVar3;
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      if (pencilmark) {
        iVar8 = row_permutation._M_elems[lVar2];
        iVar1 = col_permutation._M_elems[lVar5];
        for (lVar7 = 0; lVar7 != 9; lVar7 = lVar7 + 1) {
          cVar6 = (char)digit_permutation._M_elems[lVar7] + '1';
          if (pcVar4[lVar7] == '.') {
            cVar6 = '.';
          }
          out_puzzle.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start[digit_permutation._M_elems[lVar7] + iVar1 * 9 + iVar8 * 0x51] = cVar6;
        }
      }
      else {
        cVar6 = '.';
        if ((long)puzzle[lVar5 + lVar2 * 9] != 0x2e) {
          cVar6 = acStack_17c[(long)puzzle[lVar5 + lVar2 * 9] * 4] + '1';
        }
        out_puzzle.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)col_permutation._M_elems[lVar5] + (long)row_permutation._M_elems[lVar2] * 9]
             = cVar6;
      }
      pcVar4 = pcVar4 + 9;
    }
    pcVar3 = pcVar3 + 0x51;
  }
  uStack_e0 = 0x105275;
  strncpy(puzzle,out_puzzle.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__new_size);
  uStack_e0 = 0x10527d;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&out_puzzle.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void Util::PermuteSudoku(char *puzzle, bool pencilmark) {
    array<int, 9> digit_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    shuffle(digit_permutation.begin(), digit_permutation.end(), rng_);

    array<int, 9> row_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    array<int, 9> col_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    BlockShuffle(&col_permutation);
    BlockShuffle(&row_permutation);

    size_t row_size = pencilmark ? 81 : 9;
    size_t puzzle_size = row_size * 9;

    vector<char> out_puzzle;
    out_puzzle.resize(puzzle_size);

    for (int row = 0; row < 9; row++) {
        for (int col = 0; col < 9; col++) {
            if (pencilmark) {
                for (int digit = 0; digit < 9; digit++) {
                    bool eliminated = puzzle[row * 81 + col * 9 + digit] == '.';
                    out_puzzle[row_permutation[row] * 81 +
                               col_permutation[col] * 9 +
                               digit_permutation[digit]] =
                            eliminated ? '.' : (char) ('1' + digit_permutation[digit]);
                }
            } else {
                char digit = puzzle[row * 9 + col];
                if (digit != '.') {
                    digit = (char) ('1' + digit_permutation[digit - '1']);
                }
                out_puzzle[row_permutation[row] * 9 + col_permutation[col]] = digit;
            }
        }
    }
    strncpy(puzzle, &out_puzzle[0], puzzle_size);
}